

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

ostream * __thiscall foxxll::request::print(request *this,ostream *out)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(out,"File object address: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," Buffer address: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," File offset: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," Transfer size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," bytes Type of transfer: ");
  pcVar2 = "WRITE";
  if (this->op_ == READ) {
    pcVar2 = "READ";
  }
  std::operator<<(poVar1,pcVar2);
  return out;
}

Assistant:

std::ostream& request::print(std::ostream& out) const
{
    out << "File object address: " << file_
        << " Buffer address: " << static_cast<void*>(buffer_)
        << " File offset: " << offset_
        << " Transfer size: " << bytes_ << " bytes"
        " Type of transfer: " << ((op_ == READ) ? "READ" : "WRITE");
    return out;
}